

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxlen.cc
# Opt level: O1

void __thiscall re2c::Node::calc_dist(Node *this)

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  _Rb_tree_node_base *p_Var5;
  uint32_t *puVar6;
  
  if (this->dist == 0xffffffff) {
    puVar1 = &this->dist;
    bVar2 = end(this);
    if (bVar2) {
      *puVar1 = 0;
    }
    else if (this->loop < 2) {
      this->loop = this->loop + 1;
      for (p_Var5 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        calc_dist(*(Node **)(p_Var5 + 1));
        uVar3 = *(uint *)(*(long *)(p_Var5 + 1) + 0x70);
        if (uVar3 != 0xffffffff) {
          if (*puVar1 != 0xffffffff) {
            puVar6 = (uint32_t *)(*(long *)(p_Var5 + 1) + 0x70);
            if (uVar3 <= *puVar1) {
              puVar6 = puVar1;
            }
            uVar3 = *puVar6;
          }
          *puVar1 = uVar3;
        }
      }
      uVar4 = this->dist + 1;
      uVar3 = 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar3 = uVar4;
      }
      this->dist = uVar3;
      this->loop = this->loop + 0xff;
    }
  }
  return;
}

Assistant:

void Node::calc_dist ()
{
	if (dist != DIST_ERROR)
	{
		return;
	}
	else if (end ())
	{
		dist = 0;
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin (); i != arcs.end (); ++i)
		{
			i->first->calc_dist ();
			if (i->first->dist != DIST_ERROR)
			{
				if (dist == DIST_ERROR)
				{
					dist = i->first->dist;
				}
				else
				{
					dist = std::max (dist, i->first->dist);
				}
			}
		}
		dist = std::min (dist + 1, DIST_MAX);
	}
}